

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Builder * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::getResults
          (Builder *__return_storage_ptr__,RpcCallContext *this,Maybe<capnp::MessageSize> *sizeHint)

{
  uint *puVar1;
  bool bVar2;
  RpcConnectionState *pRVar3;
  Disposer *pDVar4;
  RpcServerResponse *pRVar5;
  undefined8 *puVar6;
  OutgoingRpcMessage *pOVar7;
  int iVar8;
  uint64_t in_RAX;
  LocallyRedirectedRpcResponse *this_00;
  ulong uVar9;
  uint in_ECX;
  Refcounted *refcounted;
  SegmentBuilder *pSVar10;
  RpcServerResponse *pRVar11;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,_std::nullptr_t> OVar12;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> local_b8;
  PointerBuilder local_a8;
  undefined1 local_88 [24];
  WirePointer *pWStack_70;
  StructDataBitCount local_68;
  StructPointerCount SStack_64;
  undefined2 uStack_62;
  SegmentBuilder *local_60;
  CapTableBuilder *pCStack_58;
  WirePointer *local_50;
  StructBuilder local_48;
  
  if ((this->response).ptr.ptr == (RpcServerResponse *)0x0) {
    if ((this->redirectResults == false) &&
       (pRVar3 = (this->connectionState).ptr, (pRVar3->connection).tag == 1)) {
      bVar2 = (sizeHint->ptr).isSet;
      if (bVar2 == true) {
        in_RAX = (sizeHint->ptr).field_1.value.wordCount;
        in_ECX = (sizeHint->ptr).field_1.value.capCount;
      }
      puVar6 = *(undefined8 **)((long)&(pRVar3->connection).field_1 + 0x10);
      iVar8 = 0;
      if (bVar2 != false) {
        uVar9 = (in_RAX + in_ECX * 4 + 1) - (ulong)(in_ECX == 0);
        if (0xfffff < uVar9) {
          uVar9 = 0x100000;
        }
        iVar8 = (int)uVar9 + 8;
      }
      (**(code **)*puVar6)(&local_b8,puVar6,iVar8);
      (**(local_b8.ptr)->_vptr_OutgoingRpcMessage)(&local_60);
      local_a8.pointer = local_50;
      local_a8.segment = local_60;
      local_a8.capTable = pCStack_58;
      PointerBuilder::initStruct(&local_48,&local_a8,(StructSize)0x10001);
      *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_48.data)->value = 3;
      local_a8.segment = local_48.segment;
      local_a8.capTable = local_48.capTable;
      local_a8.pointer = local_48.pointers;
      PointerBuilder::initStruct((StructBuilder *)local_88,&local_a8,(StructSize)0x10002);
      (this->returnMessage)._builder.dataSize = local_68;
      (this->returnMessage)._builder.pointerCount = SStack_64;
      *(undefined2 *)&(this->returnMessage)._builder.field_0x26 = uStack_62;
      (this->returnMessage)._builder.data = (void *)local_88._16_8_;
      (this->returnMessage)._builder.pointers = pWStack_70;
      (this->returnMessage)._builder.segment =
           (SegmentBuilder *)CONCAT71(local_88._1_7_,local_88[0]);
      (this->returnMessage)._builder.capTable = (CapTableBuilder *)local_88._8_8_;
      pRVar3 = (this->connectionState).ptr;
      local_48.segment = (this->returnMessage)._builder.segment;
      local_48.capTable = (this->returnMessage)._builder.capTable;
      local_48.data = (this->returnMessage)._builder.pointers;
      PointerBuilder::getStruct
                ((StructBuilder *)local_88,(PointerBuilder *)&local_48,(StructSize)0x20000,
                 (word *)0x0);
      OVar12 = kj::
               heap<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::OutgoingRpcMessage,decltype(nullptr)>,capnp::rpc::Payload::Builder>
                         ((kj *)&local_a8,pRVar3,&local_b8,(Builder *)local_88);
      pRVar11 = (RpcServerResponse *)local_a8.capTable;
      pSVar10 = local_a8.segment;
      pOVar7 = local_b8.ptr;
      if (local_b8.ptr != (OutgoingRpcMessage *)0x0) {
        local_b8.ptr = (OutgoingRpcMessage *)0x0;
        (**(local_b8.disposer)->_vptr_Disposer)
                  (local_b8.disposer,
                   pOVar7->_vptr_OutgoingRpcMessage[-2] + (long)&pOVar7->_vptr_OutgoingRpcMessage,
                   OVar12.ptr);
      }
    }
    else {
      this_00 = (LocallyRedirectedRpcResponse *)operator_new(0x110);
      local_88[0] = (sizeHint->ptr).isSet;
      if (local_88[0] == true) {
        local_88._8_8_ = (sizeHint->ptr).field_1.value.wordCount;
        local_88._16_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
      }
      LocallyRedirectedRpcResponse::LocallyRedirectedRpcResponse
                (this_00,(Maybe<capnp::MessageSize> *)local_88);
      pSVar10 = (SegmentBuilder *)&this_00->super_Refcounted;
      puVar1 = &(this_00->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      pRVar11 = &this_00->super_RpcServerResponse;
    }
    (**pRVar11->_vptr_RpcServerResponse)(__return_storage_ptr__,pRVar11);
    pDVar4 = (this->response).ptr.disposer;
    pRVar5 = (this->response).ptr.ptr;
    (this->response).ptr.disposer = (Disposer *)pSVar10;
    (this->response).ptr.ptr = pRVar11;
    if (pRVar5 != (RpcServerResponse *)0x0) {
      (**pDVar4->_vptr_Disposer)
                (pDVar4,pRVar5->_vptr_RpcServerResponse[-2] + (long)&pRVar5->_vptr_RpcServerResponse
                );
    }
  }
  else {
    (**((this->response).ptr.ptr)->_vptr_RpcServerResponse)(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
      KJ_IF_SOME(r, response) {
        return r->getResultsBuilder();
      } else {
        kj::Own<RpcServerResponse> response;

        if (redirectResults || !connectionState->connection.is<Connected>()) {
          response = kj::refcounted<LocallyRedirectedRpcResponse>(sizeHint);
        } else {
          auto message = connectionState->connection.get<Connected>().connection
              ->newOutgoingMessage(
                  firstSegmentSize(sizeHint, messageSizeHint<rpc::Return>() +
                                  sizeInWords<rpc::Payload>()));
          returnMessage = message->getBody().initAs<rpc::Message>().initReturn();
          response = kj::heap<RpcServerResponseImpl>(
              *connectionState, kj::mv(message), returnMessage.getResults());
        }

        auto results = response->getResultsBuilder();
        this->response = kj::mv(response);
        return results;
      }